

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cwd-and-chdir.c
# Opt level: O1

int run_test_cwd_and_chdir(void)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  size_t size1;
  size_t size2;
  char buffer_orig [1024];
  char buffer_new [1024];
  undefined1 auStack_8b8 [152];
  undefined1 local_808 [2056];
  
  iVar1 = uv_cwd(local_808);
  if (iVar1 != -0x69) {
    run_test_cwd_and_chdir_cold_1();
  }
  run_test_cwd_and_chdir_cold_2();
  run_test_cwd_and_chdir_cold_3();
  run_test_cwd_and_chdir_cold_9();
  run_test_cwd_and_chdir_cold_8();
  run_test_cwd_and_chdir_cold_4();
  run_test_cwd_and_chdir_cold_5();
  run_test_cwd_and_chdir_cold_6();
  run_test_cwd_and_chdir_cold_7();
  lVar2 = uv_default_loop();
  if (lVar2 == 0) {
    run_test_default_loop_close_cold_13();
LAB_0014dc96:
    run_test_default_loop_close_cold_1();
LAB_0014dc9b:
    run_test_default_loop_close_cold_2();
LAB_0014dca0:
    run_test_default_loop_close_cold_3();
LAB_0014dca5:
    run_test_default_loop_close_cold_4();
LAB_0014dcaa:
    run_test_default_loop_close_cold_5();
LAB_0014dcaf:
    run_test_default_loop_close_cold_12();
LAB_0014dcb4:
    run_test_default_loop_close_cold_6();
LAB_0014dcb9:
    run_test_default_loop_close_cold_7();
LAB_0014dcbe:
    run_test_default_loop_close_cold_8();
LAB_0014dcc3:
    run_test_default_loop_close_cold_9();
  }
  else {
    iVar1 = uv_timer_init(lVar2,auStack_8b8);
    if (iVar1 != 0) goto LAB_0014dc96;
    iVar1 = uv_timer_start(auStack_8b8,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014dc9b;
    iVar1 = uv_run(lVar2,0);
    if (iVar1 != 0) goto LAB_0014dca0;
    if (timer_cb_called != 1) goto LAB_0014dca5;
    iVar1 = uv_loop_close(lVar2);
    if (iVar1 != 0) goto LAB_0014dcaa;
    lVar2 = uv_default_loop();
    if (lVar2 == 0) goto LAB_0014dcaf;
    iVar1 = uv_timer_init(lVar2,auStack_8b8);
    if (iVar1 != 0) goto LAB_0014dcb4;
    iVar1 = uv_timer_start(auStack_8b8,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014dcb9;
    iVar1 = uv_run(lVar2,0);
    if (iVar1 != 0) goto LAB_0014dcbe;
    if (timer_cb_called != 2) goto LAB_0014dcc3;
    iVar1 = uv_loop_close(lVar2);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014dccd;
    }
  }
  run_test_default_loop_close_cold_10();
LAB_0014dccd:
  run_test_default_loop_close_cold_11();
  timer_cb_called = timer_cb_called + 1;
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(cwd_and_chdir) {
  char buffer_orig[PATHMAX];
  char buffer_new[PATHMAX];
  size_t size1;
  size_t size2;
  int err;

  size1 = 1;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == UV_ENOBUFS);
  ASSERT(size1 > 1);

  size1 = sizeof buffer_orig;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == 0);
  ASSERT(size1 > 0);
  ASSERT(buffer_orig[size1] != '/');

  err = uv_chdir(buffer_orig);
  ASSERT(err == 0);

  size2 = sizeof buffer_new;
  err = uv_cwd(buffer_new, &size2);
  ASSERT(err == 0);

  ASSERT(size1 == size2);
  ASSERT(strcmp(buffer_orig, buffer_new) == 0);

  return 0;
}